

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapParser.cpp
# Opt level: O0

bool rc::detail::(anonymous_namespace)::
     parseString<rc::detail::(anonymous_namespace)::parsePair(rc::detail::ParseState&,std::pair<std::__cxx11::string,std::__cxx11::string>&)::__0>
               (string *state,string *value)

{
  bool bVar1;
  string *value_00;
  string local_40 [32];
  string *local_20;
  string *value_local;
  ParseState *state_local;
  
  local_20 = value;
  value_local = state;
  bVar1 = ParseState::end((ParseState *)state);
  if (bVar1) {
    std::__cxx11::string::string(local_40);
    std::__cxx11::string::operator=((string *)local_20,local_40);
    std::__cxx11::string::~string(local_40);
  }
  else {
    bVar1 = anon_unknown_0::parseQuotedString
                      ((anon_unknown_0 *)value_local,(ParseState *)local_20,value_00);
    if (!bVar1) {
      takeWhile<rc::detail::(anonymous_namespace)::parsePair(rc::detail::ParseState&,std::pair<std::__cxx11::string,std::__cxx11::string>&)::__0>
                ((ParseState *)value_local,local_20,
                 (anon_class_1_0_00000001 *)((long)&state_local + 6));
    }
  }
  return true;
}

Assistant:

bool parseString(ParseState &state, std::string &value, Pred pred) {
  if (state.end()) {
    value = std::string();
    return true;
  }

  if (!parseQuotedString(state, value)) {
    takeWhile(state, value, pred);
  }
  return true;
}